

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gibbs.cpp
# Opt level: O3

void __thiscall
merlin::gibbs::write_solution
          (gibbs *this,ostream *out,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *evidence,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *old2new,graphical_model *orig,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *dummies,
          int output_format)

{
  Type TVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  mapped_type mVar5;
  char cVar6;
  ostream *poVar7;
  double *pdVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  pointer pmVar11;
  runtime_error *this_00;
  _Base_ptr p_Var12;
  pointer pmVar13;
  _Rb_tree_header *p_Var14;
  _Base_ptr p_Var15;
  mapped_type mVar16;
  double dVar17;
  double dVar18;
  string err_msg;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  _Rb_tree_header *local_78;
  undefined8 uStack_70;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_60;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_58;
  _Rb_tree_header *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_60 = evidence;
  if (output_format == 10) {
    TVar1 = (this->m_task).t_;
    cVar6 = (char)out;
    if (TVar1 == MAP) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"MAP",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      local_98[0] = (undefined1 *)0x0;
      if ((orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        p_Var14 = &(dummies->_M_t)._M_impl.super__Rb_tree_header;
        do {
          p_Var12 = (dummies->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var15 = &p_Var14->_M_header;
          if (p_Var12 == (_Base_ptr)0x0) {
LAB_0014aa9f:
            std::
            map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::at(local_60,(key_type *)local_98);
            std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
            std::ostream::_M_insert<unsigned_long>((ulong)out);
          }
          else {
            do {
              if (*(undefined1 **)(p_Var12 + 1) >= local_98[0]) {
                p_Var15 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[*(undefined1 **)(p_Var12 + 1) < local_98[0]];
            } while (p_Var12 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var15 == p_Var14) ||
               (local_98[0] < (undefined1 *)((_Rb_tree_header *)p_Var15)->_M_node_count))
            goto LAB_0014aa9f;
          }
          local_98[0] = local_98[0] + 1;
        } while (local_98[0] <
                 (undefined1 *)
                 ((long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
    }
    else {
      if (TVar1 != MAR) {
        return;
      }
      local_58 = old2new;
      std::__ostream_insert<char,std::char_traits<char>>(out,"MAR",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      local_98[0] = (undefined1 *)0x0;
      if ((orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_50 = &(dummies->_M_t)._M_impl.super__Rb_tree_header;
        do {
          p_Var12 = (dummies->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var14 = local_50;
          if (p_Var12 == (_Base_ptr)0x0) {
LAB_0014a7e2:
            local_48 = (orig->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)local_98[0]];
            uStack_40 = 0;
            local_78 = (_Rb_tree_header *)(local_48 - 9.223372036854776e+18);
            uStack_70 = 0;
            pmVar10 = std::
                      map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      ::at(local_60,(key_type *)local_98);
            mVar5 = *pmVar10;
            std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
            uVar9 = (long)(double)local_78 & (long)local_48 >> 0x3f | (long)local_48;
            std::ostream::_M_insert<unsigned_long>((ulong)out);
            if (uVar9 != 0) {
              mVar16 = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
                lVar2 = *(long *)out;
                lVar3 = *(long *)(lVar2 + -0x18);
                *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xfffffefb | 4;
                *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 8) = 6;
                dVar17 = 1.0;
                if (mVar5 != mVar16) {
                  dVar17 = 0.0;
                }
                std::ostream::_M_insert<double>(dVar17);
                mVar16 = mVar16 + 1;
              } while (uVar9 != mVar16);
            }
          }
          else {
            do {
              if (*(undefined1 **)(p_Var12 + 1) >= local_98[0]) {
                p_Var14 = (_Rb_tree_header *)p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[*(undefined1 **)(p_Var12 + 1) < local_98[0]];
            } while (p_Var12 != (_Base_ptr)0x0);
            if ((p_Var14 == local_50) || (local_98[0] < (undefined1 *)p_Var14->_M_node_count))
            goto LAB_0014a7e2;
          }
          local_98[0] = local_98[0] + 1;
        } while (local_98[0] <
                 (undefined1 *)
                 ((long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
  }
  else {
    if (output_format != 0xb) {
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Unknown output format","")
      ;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(string *)local_98);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(out," \"algorithm\" : \"gibbs\", ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(out," \"samples\" : ",0xd);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
    TVar1 = (this->m_task).t_;
    if (TVar1 == MAP) {
      std::__ostream_insert<char,std::char_traits<char>>(out," \"task\" : \"MAP\", ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"value\" : ",0xb);
      lVar2 = *(long *)out;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 8) = 6;
      local_78 = (_Rb_tree_header *)this->m_lb;
      pdVar8 = (orig->m_global_const).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar4 = (orig->m_global_const).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pdVar8 == pdVar4) {
        dVar17 = -INFINITY;
      }
      else {
        dVar18 = -INFINITY;
        do {
          dVar17 = *pdVar8;
          if (*pdVar8 <= dVar18) {
            dVar17 = dVar18;
          }
          pdVar8 = pdVar8 + 1;
          dVar18 = dVar17;
        } while (pdVar8 != pdVar4);
      }
      dVar17 = log(dVar17);
      poVar7 = std::ostream::_M_insert<double>(dVar17 + (double)local_78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"status\" : \"true\", ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"solution\" : [ ",0x10);
      local_98[0] = (undefined1 *)0x0;
      pmVar11 = (orig->m_vadj).
                super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pmVar13 = (orig->m_vadj).
                super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pmVar13 != pmVar11) {
        p_Var14 = &(dummies->_M_t)._M_impl.super__Rb_tree_header;
        do {
          p_Var12 = (dummies->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var15 = &p_Var14->_M_header;
          if (p_Var12 == (_Base_ptr)0x0) {
LAB_0014b06d:
            std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
            std::__ostream_insert<char,std::char_traits<char>>(out," \"variable\" : ",0xe);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
            std::
            map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::at(local_60,(key_type *)local_98);
            std::__ostream_insert<char,std::char_traits<char>>(out," \"value\" : ",0xb);
            std::ostream::_M_insert<unsigned_long>((ulong)out);
            std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
            pmVar11 = (orig->m_vadj).
                      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pmVar13 = (orig->m_vadj).
                      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (local_98[0] != (undefined1 *)(((long)pmVar13 - (long)pmVar11 >> 5) - 1U)) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
              pmVar11 = (orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pmVar13 = (orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
          }
          else {
            do {
              if (*(undefined1 **)(p_Var12 + 1) >= local_98[0]) {
                p_Var15 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[*(undefined1 **)(p_Var12 + 1) < local_98[0]];
            } while (p_Var12 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var15 == p_Var14) ||
               (local_98[0] < (undefined1 *)((_Rb_tree_header *)p_Var15)->_M_node_count))
            goto LAB_0014b06d;
          }
          local_98[0] = local_98[0] + 1;
        } while (local_98[0] < (undefined1 *)((long)pmVar13 - (long)pmVar11 >> 5));
      }
    }
    else {
      if (TVar1 != MAR) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>(out," \"task\" : \"MAR\", ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"value\" : ",0xb);
      lVar2 = *(long *)out;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 8) = 6;
      local_78 = (_Rb_tree_header *)this->m_lb;
      pdVar8 = (orig->m_global_const).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar4 = (orig->m_global_const).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pdVar8 == pdVar4) {
        dVar17 = -INFINITY;
      }
      else {
        dVar18 = -INFINITY;
        do {
          dVar17 = *pdVar8;
          if (*pdVar8 <= dVar18) {
            dVar17 = dVar18;
          }
          pdVar8 = pdVar8 + 1;
          dVar18 = dVar17;
        } while (pdVar8 != pdVar4);
      }
      local_58 = old2new;
      dVar17 = log(dVar17);
      poVar7 = std::ostream::_M_insert<double>(dVar17 + (double)local_78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"status\" : \"true\", ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"marginals\" : [ ",0x11);
      local_98[0] = (undefined1 *)0x0;
      pmVar11 = (orig->m_vadj).
                super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pmVar13 = (orig->m_vadj).
                super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pmVar13 != pmVar11) {
        local_78 = &(dummies->_M_t)._M_impl.super__Rb_tree_header;
        do {
          p_Var12 = (dummies->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var14 = local_78;
          if (p_Var12 == (_Base_ptr)0x0) {
LAB_0014ace3:
            dVar17 = (orig->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)local_98[0]];
            uVar9 = (ulong)dVar17;
            uVar9 = (long)(dVar17 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
            std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
            std::__ostream_insert<char,std::char_traits<char>>(out," \"variable\" : ",0xe);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            std::__ostream_insert<char,std::char_traits<char>>(out," \"states\" : ",0xc);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            std::__ostream_insert<char,std::char_traits<char>>(out," \"probabilities\" : [",0x14);
            pmVar10 = std::
                      map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      ::at(local_60,(key_type *)local_98);
            if (uVar9 != 0) {
              mVar5 = *pmVar10;
              mVar16 = 0;
              do {
                lVar2 = *(long *)out;
                lVar3 = *(long *)(lVar2 + -0x18);
                *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xfffffefb | 4;
                *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 8) = 6;
                dVar17 = 1.0;
                if (mVar5 != mVar16) {
                  dVar17 = 0.0;
                }
                std::ostream::_M_insert<double>(dVar17);
                if (uVar9 - 1 != mVar16) {
                  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
                }
                mVar16 = mVar16 + 1;
              } while (uVar9 != mVar16);
            }
            std::__ostream_insert<char,std::char_traits<char>>(out,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
            pmVar11 = (orig->m_vadj).
                      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pmVar13 = (orig->m_vadj).
                      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (local_98[0] != (undefined1 *)(((long)pmVar13 - (long)pmVar11 >> 5) - 1U)) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
              pmVar11 = (orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pmVar13 = (orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
          }
          else {
            do {
              if (*(undefined1 **)(p_Var12 + 1) >= local_98[0]) {
                p_Var14 = (_Rb_tree_header *)p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[*(undefined1 **)(p_Var12 + 1) < local_98[0]];
            } while (p_Var12 != (_Base_ptr)0x0);
            if ((p_Var14 == local_78) || (local_98[0] < (undefined1 *)p_Var14->_M_node_count))
            goto LAB_0014ace3;
          }
          local_98[0] = local_98[0] + 1;
        } while (local_98[0] < (undefined1 *)((long)pmVar13 - (long)pmVar11 >> 5));
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"] ",2);
  }
  return;
}

Assistant:

void gibbs::write_solution(std::ostream& out, const std::map<size_t, size_t>& evidence,
		const std::map<size_t, size_t>& old2new, const graphical_model& orig,
		const std::set<size_t>& dummies, int output_format) {

	if (output_format == MERLIN_OUTPUT_JSON) {
		out << "{";
		out << " \"algorithm\" : \"gibbs\", ";
		out << " \"samples\" : " << m_samples.size() << ", ";
		switch (m_task) {
		case Task::MAR:
			{
				out << " \"task\" : \"MAR\", ";
				out << " \"value\" : " << std::fixed
					<< std::setprecision(MERLIN_PRECISION)
					<< (m_lb + std::log(orig.get_global_const())) << ", ";
				out << " \"status\" : \"true\", ";
				out << " \"marginals\" : [ ";
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					variable v = orig.var(i);
					out << "{";
					out << " \"variable\" : " << v.label() << ", ";
					out << " \"states\" : " << v.states() << ", ";
					out << " \"probabilities\" : [";
					try { // evidence variable
						size_t val = evidence.at(i);
						for (size_t k = 0; k < v.states(); ++k) {
							out << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< (k == val ? 1.0 : 0.0);
							if (k != v.states() - 1) {
								out << ", ";
							}
						}
						out << "] ";
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex vx = old2new.at(i);
						variable VX = var(vx);
						for (size_t k = 0; k < VX.states(); ++k) {
							out << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< belief(VX)[k];
							if (k != VX.states() - 1) {
								out << ", ";
							}
						}
						out << "] ";
					}

					out << "}";
					if (i != orig.nvar() - 1) {
						out << ", ";
					}
				} // end for
				out << "] ";
				break;
			}
		case Task::MAP:
			{
				out << " \"task\" : \"MAP\", ";
				out << " \"value\" : " << std::fixed
					<< std::setprecision(MERLIN_PRECISION)
					<< (m_lb + std::log(orig.get_global_const())) << ", ";
				out << " \"status\" : \"true\", ";
				out << " \"solution\" : [ ";
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					out << "{";
					out << " \"variable\" : " << i << ",";

					try { // evidence variable
						size_t val = evidence.at(i);
						out << " \"value\" : " << val;
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex j = old2new.at(i);
						out << " \"value\" : " << m_best_config[j];
					}
					out << "}";
					if (i != orig.nvar() - 1) {
						out << ", ";
					}
				}
				out << "] ";
				break;
			}
		default:
			break;
		} // end switch
	} else if (output_format == MERLIN_OUTPUT_UAI) {
		// Ouput marginals (ie, beliefs)
		switch (m_task) {
		case Task::MAR:
			{
				out << "MAR" << std::endl;
				out << orig.nvar() - dummies.size();
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					variable v = orig.var(i);
					try { // evidence variable
						size_t val = evidence.at(i);
						out << " " << v.states();
						for (size_t k = 0; k < v.states(); ++k) {
							out << " " << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< (k == val ? 1.0 : 0.0);
						}
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex vx = old2new.at(i);
						variable VX = var(vx);
						out << " " << VX.states();
						for (size_t k = 0; k < VX.states(); ++k) {
							out << " " << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< belief(VX)[k];
						}
					}
				} // end for
				out << std::endl;
				break;
			}
		case Task::MAP:
			{
				out << "MAP" << std::endl;
				out << orig.nvar() - dummies.size();
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					try { // evidence variable
						size_t val = evidence.at(i);
						out << " " << val;
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex j = old2new.at(i);
						out << " " << m_best_config[j];
					}
				}
				out << std::endl;
				break;
			}
		default:
			break;
		} // end switch
	} else {
		std::string err_msg("Unknown output format");
		throw std::runtime_error(err_msg);
	}
}